

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_regex_traits.hpp
# Opt level: O3

char_class_type __thiscall
boost::xpressive::cpp_regex_traits<char>::lookup_classname<char_const*>
          (cpp_regex_traits<char> *this,char *begin,char *end,bool icase)

{
  long lVar1;
  char cVar2;
  char_class_type cVar3;
  ushort uVar4;
  long lVar5;
  string_type classname;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48;
  char local_40 [16];
  
  cVar3 = lookup_classname_impl_<char_const*>(begin,end);
  if (cVar3 == 0) {
    local_50._M_current = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,begin,end);
    lVar1 = local_48;
    if (local_48 == 0) {
      local_48 = 0;
    }
    else {
      lVar5 = 0;
      do {
        cVar2 = (**(code **)(*(long *)this->ctype_ + 0x20))
                          (this->ctype_,(int)local_50._M_current[lVar5]);
        local_50._M_current[lVar5] = cVar2;
        lVar5 = lVar5 + 1;
      } while (lVar1 != lVar5);
    }
    cVar3 = lookup_classname_impl_<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                      (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )(local_50._M_current + local_48));
    if (local_50._M_current != local_40) {
      operator_delete(local_50._M_current);
    }
  }
  uVar4 = cVar3 | 0x300;
  if (!icase) {
    uVar4 = cVar3;
  }
  if ((cVar3 & 0x300) == 0) {
    uVar4 = cVar3;
  }
  return uVar4;
}

Assistant:

char_class_type lookup_classname(FwdIter begin, FwdIter end, bool icase) const
    {
        static detail::umaskex_t const icase_masks =
            detail::std_ctype_lower | detail::std_ctype_upper;

        BOOST_ASSERT(begin != end);
        char_class_type char_class = this->lookup_classname_impl_(begin, end);
        if(0 == char_class)
        {
            // convert the string to lowercase
            string_type classname(begin, end);
            for(typename string_type::size_type i = 0, len = classname.size(); i < len; ++i)
            {
                classname[i] = this->translate_nocase(classname[i]);
            }
            char_class = this->lookup_classname_impl_(classname.begin(), classname.end());
        }
        // erase case-sensitivity if icase==true
        if(icase && 0 != (char_class & icase_masks))
        {
            char_class |= icase_masks;
        }
        return char_class;
    }